

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

int parse_der_signature(uchar *der,size_t len,mp_int *r,mp_int *s)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  
  uVar2 = 0;
  if ((*der & 0x3f) == 0x30) {
    pbVar9 = der + len;
    bVar1 = der[1];
    pbVar7 = der + 2;
    uVar4 = bVar1 & 0x7f;
    uVar5 = (ulong)uVar4;
    if ((char)bVar1 < '\0') {
      if ((char)uVar4 == '\0') {
        uVar5 = 0;
      }
      else {
        lVar6 = 0;
        uVar5 = 0;
        do {
          uVar5 = (ulong)pbVar7[lVar6] | uVar5 << 8;
          lVar6 = lVar6 + 1;
        } while ((bVar1 & 0x7f) != (uint)lVar6);
        pbVar7 = der + (ulong)(uVar4 - 1) + 3;
      }
    }
    if (der + uVar5 + 1 <= pbVar9) {
      bVar1 = *pbVar7;
      if ((bVar1 & 0x3f) == 2) {
        bVar1 = pbVar7[1];
        pbVar8 = pbVar7 + 2;
        uVar2 = bVar1 & 0x7f;
        uVar5 = (ulong)uVar2;
        if ((char)bVar1 < '\0') {
          if ((char)uVar2 == '\0') {
            uVar5 = 0;
          }
          else {
            lVar6 = 0;
            uVar5 = 0;
            do {
              uVar5 = (ulong)pbVar8[lVar6] | uVar5 << 8;
              lVar6 = lVar6 + 1;
            } while ((bVar1 & 0x7f) != (uint)lVar6);
            pbVar8 = pbVar7 + (ulong)(uVar2 - 1) + 3;
          }
        }
        pbVar7 = pbVar8 + uVar5;
        if (pbVar9 < pbVar7) {
          return 0;
        }
        iVar3 = mp_read_unsigned_bin(r,pbVar8,(int)uVar5);
        if (iVar3 != 0) {
          return 0;
        }
        bVar1 = *pbVar7;
      }
      uVar2 = 0;
      if ((bVar1 & 0x3f) == 2) {
        bVar1 = pbVar7[1];
        pbVar8 = pbVar7 + 2;
        uVar4 = bVar1 & 0x7f;
        uVar5 = (ulong)uVar4;
        if ((char)bVar1 < '\0') {
          if ((char)uVar4 == '\0') {
            uVar5 = 0;
          }
          else {
            lVar6 = 0;
            uVar5 = 0;
            do {
              uVar5 = (ulong)pbVar8[lVar6] | uVar5 << 8;
              lVar6 = lVar6 + 1;
            } while ((bVar1 & 0x7f) != (uint)lVar6);
            pbVar8 = pbVar7 + (ulong)(uVar4 - 1) + 3;
          }
        }
        if (pbVar8 + uVar5 <= pbVar9) {
          iVar3 = mp_read_unsigned_bin(s,pbVar8,(int)uVar5);
          uVar2 = (uint)(iVar3 == 0);
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int parse_der_signature(const unsigned char* der, size_t len, mp_int* r, mp_int* s)
{
	const unsigned char* end = der + len;

	SEQUENCE
	{
		if ((++der + _parse_length(&der)) > end)
			return 0;

		INTEGER
		{
			// r
			der++;
			size_t length = _parse_length(&der);

			if ((der + length) > end)
				return 0;

			if (mp_read_unsigned_bin(r, der, length) != MP_OKAY)
				return 0;

			der += length;
		}

		INTEGER
		{
			// s
			der++;
			size_t length = _parse_length(&der);

			if ((der + length) > end)
				return 0;

			return (mp_read_unsigned_bin(s, der, length) == MP_OKAY);
		}
	}

	return 0;
}